

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsVulkanStorageBuffer(Instruction *this)

{
  uint32_t uVar1;
  Op OVar2;
  DefUseManager *pDVar3;
  Instruction *this_00;
  DecorationManager *pDVar4;
  code *pcVar5;
  _Any_data *p_Var6;
  bool is_buffer_block;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  if (this->opcode_ == OpTypePointer) {
    pDVar3 = IRContext::get_def_use_mgr(this->context_);
    uVar1 = GetSingleWordInOperand(this,1);
    this_00 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
    OVar2 = this_00->opcode_;
    if ((OVar2 & ~OpUndef) == OpTypeArray) {
      pDVar3 = IRContext::get_def_use_mgr(this->context_);
      uVar1 = GetSingleWordInOperand(this_00,0);
      this_00 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
      OVar2 = this_00->opcode_;
    }
    if (OVar2 == OpTypeStruct) {
      uVar1 = GetSingleWordInOperand(this,0);
      if (uVar1 == 0xc) {
        is_buffer_block = false;
        pDVar4 = IRContext::get_decoration_mgr(this->context_);
        uVar1 = result_id(this_00);
        local_60._8_8_ = 0;
        local_48 = std::
                   _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:411:9)>
                   ::_M_invoke;
        local_50 = std::
                   _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:411:9)>
                   ::_M_manager;
        local_60._M_unused._M_object = &is_buffer_block;
        analysis::DecorationManager::ForEachDecoration
                  (pDVar4,uVar1,2,(function<void_(const_spvtools::opt::Instruction_&)> *)&local_60);
        if (local_50 == (code *)0x0) {
          return is_buffer_block;
        }
        p_Var6 = &local_60;
        pcVar5 = local_50;
      }
      else {
        if (uVar1 != 2) {
          return false;
        }
        is_buffer_block = false;
        pDVar4 = IRContext::get_decoration_mgr(this->context_);
        uVar1 = result_id(this_00);
        local_40._8_8_ = 0;
        local_28 = std::
                   _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:405:9)>
                   ::_M_invoke;
        local_30 = std::
                   _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:405:9)>
                   ::_M_manager;
        local_40._M_unused._M_object = &is_buffer_block;
        analysis::DecorationManager::ForEachDecoration
                  (pDVar4,uVar1,3,(function<void_(const_spvtools::opt::Instruction_&)> *)&local_40);
        if (local_30 == (code *)0x0) {
          return is_buffer_block;
        }
        p_Var6 = &local_40;
        pcVar5 = local_30;
      }
      (*pcVar5)(p_Var6,p_Var6,__destroy_functor);
      return is_buffer_block;
    }
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanStorageBuffer() const {
  // Is there a difference between a "Storage buffer" and a "dynamic storage
  // buffer" in SPIR-V and do we care about the difference?
  if (opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  Instruction* base_type =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(1));

  // Unpack the optional layer of arraying.
  if (base_type->opcode() == spv::Op::OpTypeArray ||
      base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
    base_type = context()->get_def_use_mgr()->GetDef(
        base_type->GetSingleWordInOperand(0));
  }

  if (base_type->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kPointerTypeStorageClassIndex));
  if (storage_class == spv::StorageClass::Uniform) {
    bool is_buffer_block = false;
    context()->get_decoration_mgr()->ForEachDecoration(
        base_type->result_id(), uint32_t(spv::Decoration::BufferBlock),
        [&is_buffer_block](const Instruction&) { is_buffer_block = true; });
    return is_buffer_block;
  } else if (storage_class == spv::StorageClass::StorageBuffer) {
    bool is_block = false;
    context()->get_decoration_mgr()->ForEachDecoration(
        base_type->result_id(), uint32_t(spv::Decoration::Block),
        [&is_block](const Instruction&) { is_block = true; });
    return is_block;
  }
  return false;
}